

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

vector<int,_std::allocator<int>_> *
cppcms::json::traits<std::vector<int,_std::allocator<int>_>_>::get
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,value *v)

{
  int iVar1;
  array *paVar2;
  pointer pvVar3;
  uint uVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar2 = json::value::array(v);
  std::vector<int,_std::allocator<int>_>::resize
            (__return_storage_ptr__,
             (long)(paVar2->
                   super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(paVar2->
                   super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  pvVar3 = (paVar2->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((paVar2->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
      _M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      iVar1 = traits<int>::get(pvVar3 + uVar5);
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5] = iVar1;
      uVar5 = (ulong)uVar4;
      pvVar3 = (paVar2->
               super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)((long)(paVar2->
                                   super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> get(value const &v)
		{
			std::vector<T> result;
			json::array const &a=v.array();
			result.resize(a.size());
			for(unsigned i=0;i<a.size();i++) 
				result[i]=a[i].get_value<T>();
			return result;
		}